

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttpload.c
# Opt level: O0

FT_Error tt_face_load_hdmx(TT_Face face,FT_Stream stream)

{
  unsigned_long uVar1;
  FT_Byte *pFVar2;
  FT_Stream_CloseFunc p_Var3;
  FT_Byte *limit;
  FT_Byte *p;
  FT_ULong record_size;
  FT_ULong table_size;
  FT_UInt num_records;
  FT_UInt nn;
  FT_Memory memory;
  FT_Stream pFStack_20;
  FT_Error error;
  FT_Stream stream_local;
  TT_Face face_local;
  
  _num_records = stream->memory;
  pFStack_20 = stream;
  stream_local = (FT_Stream)face;
  memory._4_4_ = (*face->goto_table)(face,0x68646d78,stream,&record_size);
  if ((memory._4_4_ == 0) && (7 < record_size)) {
    memory._4_4_ = FT_Stream_ExtractFrame(pFStack_20,record_size,(FT_Byte **)&stream_local[0xf].pos)
    ;
    if (memory._4_4_ == 0) {
      uVar1 = stream_local[0xf].pos;
      pFVar2 = (FT_Byte *)(uVar1 + record_size);
      table_size._0_4_ = (uint)CONCAT11(*(undefined1 *)(uVar1 + 2),*(undefined1 *)(uVar1 + 3));
      limit = (FT_Byte *)(uVar1 + 8);
      p = (FT_Byte *)
          (ulong)((uint)*(byte *)(uVar1 + 4) << 0x18 | (uint)*(byte *)(uVar1 + 5) << 0x10 |
                  (uint)*(byte *)(uVar1 + 6) << 8 | (uint)*(byte *)(uVar1 + 7));
      if ((FT_Byte *)0xfffeffff < p) {
        p = (FT_Byte *)((ulong)p & 0xffff);
      }
      if (((uint)table_size < 0x100) &&
         (((uint)table_size == 0 || ((p < (FT_Byte *)0x10002 && ((FT_Byte *)0x3 < p)))))) {
        p_Var3 = (FT_Stream_CloseFunc)
                 ft_mem_realloc(_num_records,1,0,(ulong)(uint)table_size,(void *)0x0,
                                (FT_Error *)((long)&memory + 4));
        stream_local[0xf].close = p_Var3;
        if (memory._4_4_ == 0) {
          table_size._4_4_ = 0;
          for (; (table_size._4_4_ < (uint)table_size && (limit + (long)p <= pFVar2));
              limit = p + (long)limit) {
            stream_local[0xf].close[table_size._4_4_] = (_func_void_FT_Stream)*limit;
            table_size._4_4_ = table_size._4_4_ + 1;
          }
          *(uint *)&stream_local[0xf].pathname = table_size._4_4_;
          stream_local[0xf].descriptor.value = record_size;
          stream_local[0xf].read = (FT_Stream_IoFunc)p;
          return 0;
        }
      }
      else {
        memory._4_4_ = 3;
      }
      FT_Stream_ReleaseFrame(pFStack_20,(FT_Byte **)&stream_local[0xf].pos);
      stream_local[0xf].descriptor.value = 0;
    }
    return memory._4_4_;
  }
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_hdmx( TT_Face    face,
                     FT_Stream  stream )
  {
    FT_Error   error;
    FT_Memory  memory = stream->memory;
    FT_UInt    nn, num_records;
    FT_ULong   table_size, record_size;
    FT_Byte*   p;
    FT_Byte*   limit;


    /* this table is optional */
    error = face->goto_table( face, TTAG_hdmx, stream, &table_size );
    if ( error || table_size < 8 )
      return FT_Err_Ok;

    if ( FT_FRAME_EXTRACT( table_size, face->hdmx_table ) )
      goto Exit;

    p     = face->hdmx_table;
    limit = p + table_size;

    /* Given that `hdmx' tables are losing its importance (for example, */
    /* variation fonts introduced in OpenType 1.8 must not have this    */
    /* table) we no longer test for a correct `version' field.          */
    p          += 2;
    num_records = FT_NEXT_USHORT( p );
    record_size = FT_NEXT_ULONG( p );

    /* The maximum number of bytes in an hdmx device record is the */
    /* maximum number of glyphs + 2; this is 0xFFFF + 2, thus      */
    /* explaining why `record_size' is a long (which we read as    */
    /* unsigned long for convenience).  In practice, two bytes are */
    /* sufficient to hold the size value.                          */
    /*                                                             */
    /* There are at least two fonts, HANNOM-A and HANNOM-B version */
    /* 2.0 (2005), which get this wrong: The upper two bytes of    */
    /* the size value are set to 0xFF instead of 0x00.  We catch   */
    /* and fix this.                                               */

    if ( record_size >= 0xFFFF0000UL )
      record_size &= 0xFFFFU;

    /* The limit for `num_records' is a heuristic value. */
    if ( num_records > 255              ||
         ( num_records > 0            &&
           ( record_size > 0x10001L ||
             record_size < 4        ) ) )
    {
      error = FT_THROW( Invalid_File_Format );
      goto Fail;
    }

    if ( FT_NEW_ARRAY( face->hdmx_record_sizes, num_records ) )
      goto Fail;

    for ( nn = 0; nn < num_records; nn++ )
    {
      if ( p + record_size > limit )
        break;

      face->hdmx_record_sizes[nn] = p[0];
      p                          += record_size;
    }

    face->hdmx_record_count = nn;
    face->hdmx_table_size   = table_size;
    face->hdmx_record_size  = record_size;

  Exit:
    return error;

  Fail:
    FT_FRAME_RELEASE( face->hdmx_table );
    face->hdmx_table_size = 0;
    goto Exit;
  }